

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

void cvui::handleMouse(int theEvent,int theX,int theY,int theFlags,void *theData)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 uVar4;
  
  lVar2 = 0;
  do {
    lVar3 = (long)*(int *)((long)&DAT_0011b110 + lVar2);
    if (*(int *)((long)&DAT_0011b11c + lVar2) == theEvent) {
      *(undefined2 *)((long)theData + 0x2a) = 0x101;
      lVar1 = lVar3 * 3 + 0x21;
      uVar4 = 1;
LAB_001097a6:
      *(undefined1 *)((long)theData + lVar1) = 1;
      *(undefined1 *)((long)theData + lVar3 * 3 + 0x22) = uVar4;
    }
    else if (*(int *)(&DAT_0011b128 + lVar2) == theEvent) {
      *(undefined1 *)((long)theData + 0x29) = 1;
      *(undefined1 *)((long)theData + 0x2b) = 0;
      lVar1 = lVar3 * 3 + 0x20;
      uVar4 = 0;
      goto LAB_001097a6;
    }
    lVar2 = lVar2 + 4;
    if (lVar2 == 0xc) {
      *(int *)((long)theData + 0x2c) = theX;
      *(int *)((long)theData + 0x30) = theY;
      return;
    }
  } while( true );
}

Assistant:

void handleMouse(int theEvent, int theX, int theY, int theFlags, void* theData) {
	int aButtons[3] = { cvui::LEFT_BUTTON, cvui::MIDDLE_BUTTON, cvui::RIGHT_BUTTON };
	int aEventsDown[3] = { cv::EVENT_LBUTTONDOWN, cv::EVENT_MBUTTONDOWN, cv::EVENT_RBUTTONDOWN };
	int aEventsUp[3] = { cv::EVENT_LBUTTONUP, cv::EVENT_MBUTTONUP, cv::EVENT_RBUTTONUP };

	cvui_context_t *aContext = (cvui_context_t *)theData;

	for (int i = 0; i < 3; i++) {
		int aBtn = aButtons[i];

		if (theEvent == aEventsDown[i]) {
			aContext->mouse.anyButton.justPressed = true;
			aContext->mouse.anyButton.pressed = true;
			aContext->mouse.buttons[aBtn].justPressed = true;
			aContext->mouse.buttons[aBtn].pressed = true;

		} else if (theEvent == aEventsUp[i]) {
			aContext->mouse.anyButton.justReleased = true;
			aContext->mouse.anyButton.pressed = false;
			aContext->mouse.buttons[aBtn].justReleased = true;
			aContext->mouse.buttons[aBtn].pressed = false;
		}
	}

	aContext->mouse.position.x = theX;
	aContext->mouse.position.y = theY;
}